

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O0

Download * __thiscall Download::GetFileName(Download *this,string *url)

{
  ulong uVar1;
  string *in_RDX;
  string local_80 [32];
  long local_60;
  size_t index;
  allocator local_41;
  string local_40 [8];
  string pathSeparator;
  string *url_local;
  Download *this_local;
  string *fileName;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"/",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  index._3_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",(allocator *)((long)&index + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&index + 2));
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (local_60 = std::__cxx11::string::rfind(in_RDX,(ulong)local_40), local_60 != -1)) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_80,(ulong)in_RDX);
    std::__cxx11::string::operator=((string *)this,local_80);
    std::__cxx11::string::~string(local_80);
  }
  index._3_1_ = 1;
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

std::string Download::GetFileName(const std::string &url)
{
#ifdef __WIN32
	std::string pathSeparator = "\\";
#else 
	std::string pathSeparator = "/";
#endif
	std::string fileName="";
	if(!url.empty())
	{
		size_t index = url.rfind(pathSeparator);
		if(index != std::string::npos)
		{
			fileName = url.substr(index+pathSeparator.size());
		}
	}
	return fileName;	
}